

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations::Print
          (ForwardDeclarations *this,Printer *printer,Options *options)

{
  size_type sVar1;
  pointer pcVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*>_>_>
  *pmVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_60;
  ForwardDeclarations *local_40;
  _Rb_tree_node_base *local_38;
  
  local_40 = this;
  for (p_Var4 = (this->enums_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->enums_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    io::Printer::Print(printer,"enum $enumname$ : int;\n","enumname",(string *)(p_Var4 + 1));
    io::Printer::Annotate<google::protobuf::EnumDescriptor>
              (printer,"enumname","enumname",*(EnumDescriptor **)(p_Var4 + 2));
    io::Printer::Print(printer,"bool $enumname$_IsValid(int value);\n","enumname",
                       (string *)(p_Var4 + 1));
  }
  p_Var5 = (local_40->classes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(local_40->classes_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != local_38) {
    do {
      io::Printer::Print(printer,"class $classname$;\n","classname",(string *)(p_Var5 + 1));
      io::Printer::Annotate<google::protobuf::Descriptor>
                (printer,"classname","classname",*(Descriptor **)(p_Var5 + 2));
      sVar1 = (options->dllexport_decl)._M_string_length;
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      if (sVar1 == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
      }
      else {
        pcVar2 = (options->dllexport_decl)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar2,pcVar2 + sVar1);
        std::__cxx11::string::append((char *)&local_60);
      }
      io::Printer::Print(printer,
                         "class $classname$DefaultTypeInternal;\n$dllexport_decl$extern $classname$DefaultTypeInternal _$classname$_default_instance_;\n"
                         ,"dllexport_decl",&local_60,"classname",(string *)(p_Var5 + 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_38);
  }
  pmVar3 = &local_40->namespaces_;
  for (p_Var4 = (local_40->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    io::Printer::Print(printer,"namespace $nsname$ {\n","nsname",(string *)(p_Var4 + 1));
    Print(*(ForwardDeclarations **)(p_Var4 + 2),printer,options);
    io::Printer::Print(printer,"}  // namespace $nsname$\n","nsname",(string *)(p_Var4 + 1));
  }
  return;
}

Assistant:

void Print(io::Printer* printer, const Options& options) const {
    for (std::map<string, const EnumDescriptor *>::const_iterator
             it = enums_.begin(),
             end = enums_.end();
         it != end; ++it) {
      printer->Print("enum $enumname$ : int;\n", "enumname", it->first);
      printer->Annotate("enumname", it->second);
      printer->Print("bool $enumname$_IsValid(int value);\n", "enumname",
                     it->first);
    }
    for (std::map<string, const Descriptor*>::const_iterator
             it = classes_.begin(),
             end = classes_.end();
         it != end; ++it) {
      printer->Print("class $classname$;\n", "classname", it->first);
      printer->Annotate("classname", it->second);

      printer->Print(
          "class $classname$DefaultTypeInternal;\n"
          "$dllexport_decl$"
          "extern $classname$DefaultTypeInternal "
          "_$classname$_default_instance_;\n",  // NOLINT
          "dllexport_decl",
          options.dllexport_decl.empty() ? "" : options.dllexport_decl + " ",
          "classname",
          it->first);
    }
    for (std::map<string, ForwardDeclarations *>::const_iterator
             it = namespaces_.begin(),
             end = namespaces_.end();
         it != end; ++it) {
      printer->Print("namespace $nsname$ {\n",
                     "nsname", it->first);
      it->second->Print(printer, options);
      printer->Print("}  // namespace $nsname$\n",
                     "nsname", it->first);
    }
  }